

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O2

void __thiscall
llama_kv_cache_unified::seq_div
          (llama_kv_cache_unified *this,llama_seq_id seq_id,llama_pos p0,llama_pos p1,int d)

{
  int *piVar1;
  int iVar2;
  pointer plVar3;
  bool bVar4;
  long lVar5;
  uint32_t i;
  ulong uVar6;
  int iVar7;
  int iVar8;
  llama_kv_cell *this_00;
  llama_seq_id local_34;
  
  if (d != 1) {
    iVar7 = 0;
    if (0 < p0) {
      iVar7 = p0;
    }
    iVar8 = 0x7fffffff;
    if ((uint)p1 < 0x7fffffff) {
      iVar8 = p1;
    }
    if (iVar7 != iVar8) {
      if (this->recurrent == false) {
        lVar5 = 0;
        for (uVar6 = 0; uVar6 < this->size; uVar6 = uVar6 + 1) {
          bVar4 = llama_kv_cell::has_seq_id
                            ((llama_kv_cell *)
                             ((long)&((this->cells).
                                      super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->pos + lVar5),
                             &local_34);
          if (bVar4) {
            plVar3 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar2 = *(int *)((long)&plVar3->pos + lVar5);
            if (iVar2 < iVar8 && iVar7 <= iVar2) {
              this->has_shift = true;
              *(int *)((long)&plVar3->pos + lVar5) = iVar2 / d;
              piVar1 = (int *)((long)&plVar3->delta + lVar5);
              *piVar1 = *piVar1 + (iVar2 / d - iVar2);
            }
          }
          lVar5 = lVar5 + 0x40;
        }
      }
      else if ((-1 < seq_id) && ((uint)seq_id < this->size)) {
        plVar3 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)plVar3[(uint)seq_id].tail;
        if (-1 < lVar5) {
          this_00 = plVar3 + lVar5;
          bVar4 = llama_kv_cell::has_seq_id(this_00,&local_34);
          if ((bVar4) && (iVar2 = this_00->pos, iVar2 < iVar8 && iVar7 <= iVar2)) {
            this_00->pos = iVar2 / d;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llama_kv_cache_unified::seq_div(llama_seq_id seq_id, llama_pos p0, llama_pos p1, int d) {
    if (d == 1) {
        return;
    }

    if (p0 < 0) {
        p0 = 0;
    }

    if (p1 < 0) {
        p1 = std::numeric_limits<llama_pos>::max();
    }

    // If there is no range then return early to avoid looping over the cache.
    if (p0 == p1) {
        return;
    }

    if (recurrent) {
        // for Mamba-like or RWKV models, only the pos needs to be changed
        if (0 <= seq_id && seq_id < (int64_t) size) {
            const int32_t tail_id = cells[seq_id].tail;
            if (tail_id >= 0) {
                llama_kv_cell & cell = cells[tail_id];
                if (cell.has_seq_id(seq_id) && p0 <= cell.pos && cell.pos < p1) {
                    cell.pos /= d;
                }
            }
        }

        return;
    }

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id) && cells[i].pos >= p0 && cells[i].pos < p1) {
            has_shift = true;

            {
                llama_pos p_old = cells[i].pos;
                cells[i].pos   /= d;
                cells[i].delta += cells[i].pos - p_old;
            }
        }
    }
}